

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
sjtu::vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::doubleSpace
          (vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *ppVar4;
  undefined8 uVar5;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *ppVar6;
  long lVar7;
  int i;
  long lVar8;
  
  ppVar4 = this->data;
  iVar3 = this->maxSize;
  this->maxSize = iVar3 * 2;
  ppVar6 = (pair<const_std::pair<unsigned_long_long,_int>,_long> *)operator_new((long)iVar3 * 0x30);
  this->data = ppVar6;
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < this->currentLength; lVar8 = lVar8 + 1) {
    ppVar6 = this->data;
    *(undefined8 *)((long)&ppVar6->second + lVar7) = *(undefined8 *)((long)&ppVar4->second + lVar7);
    puVar1 = (undefined8 *)((long)&(ppVar4->first).first + lVar7);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(ppVar6->first).first + lVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    lVar7 = lVar7 + 0x18;
  }
  operator_delete(ppVar4);
  return;
}

Assistant:

void doubleSpace() {
                T *tmp = data;
                maxSize *= 2;
                data = (T*) (operator new (maxSize * sizeof(T)));
                for (int i = 0; i < currentLength; ++i)
                        new (data + i) T(tmp[i]);
        for (T* p = tmp; p < tmp + currentLength; ++p)
            p->~T();
                operator delete (tmp);
        }